

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aloptional.h
# Opt level: O3

void __thiscall
al::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
~optional(optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *this)

{
  long *plVar1;
  long *plVar2;
  
  if (this->mHasValue == true) {
    plVar1 = (long *)(this->field_1).mValue._M_dataplus._M_p;
    plVar2 = (long *)((long)&this->field_1 + 0x10);
    if (plVar1 != plVar2) {
      operator_delete(plVar1,*plVar2 + 1);
      return;
    }
  }
  return;
}

Assistant:

~optional() { if(mHasValue) al::destroy_at(std::addressof(mValue)); }